

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::PointRenderCase::generateAttributeData
          (PointRenderCase *this)

{
  int iVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  uint *puVar5;
  reference pvVar6;
  float fVar7;
  Vector<float,_4> local_b4;
  Vector<float,_4> local_a4;
  int local_94;
  int local_90;
  int minorCoord;
  int majorCoord;
  int direction;
  int pointID;
  int ndx_1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_78;
  int local_70;
  undefined1 local_6c [4];
  int ndx;
  Random rnd;
  allocator<int> local_49;
  undefined1 local_48 [8];
  vector<int,_std::allocator<int>_> cellOrder;
  Vec4 blue;
  Vec4 green;
  PointRenderCase *this_local;
  
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(blue.m_data + 2),0.0,1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)
             &cellOrder.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0.0,0.0,1.0,1.0);
  iVar1 = *(int *)&(this->super_BBoxRenderCase).field_0xd4;
  std::allocator<int>::allocator(&local_49);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_48,(long)(iVar1 * iVar1 * 2),&local_49);
  std::allocator<int>::~allocator(&local_49);
  de::Random::Random((Random *)local_6c,0xde22446);
  local_70 = 0;
  while( true ) {
    iVar1 = local_70;
    sVar3 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)local_48);
    iVar2 = local_70;
    if ((int)sVar3 <= iVar1) break;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_48,(long)local_70);
    *pvVar4 = iVar2;
    local_70 = local_70 + 1;
  }
  local_78._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)local_48);
  _pointID = std::vector<int,_std::allocator<int>_>::end
                       ((vector<int,_std::allocator<int>_> *)local_48);
  de::Random::shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((Random *)local_6c,local_78,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)_pointID);
  sVar3 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)local_48);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (&this->m_attribData,sVar3 * 2);
  direction = 0;
  while( true ) {
    iVar1 = direction;
    sVar3 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)local_48);
    if ((int)sVar3 <= iVar1) break;
    puVar5 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)local_48,(long)direction);
    majorCoord = *puVar5;
    minorCoord = majorCoord & 1;
    local_90 = (int)(CONCAT44(majorCoord >> 0x1f,majorCoord >> 1) /
                    (long)*(int *)&(this->super_BBoxRenderCase).field_0xd4);
    local_94 = (int)(CONCAT44(majorCoord >> 0x1f,majorCoord >> 1) %
                    (long)*(int *)&(this->super_BBoxRenderCase).field_0xd4);
    if (minorCoord == 0) {
      fVar7 = (float)*(int *)&(this->super_BBoxRenderCase).field_0xd4;
      tcu::Vector<float,_4>::Vector
                (&local_b4,((float)local_90 + 0.5) / fVar7,((float)local_94 + 0.5) / fVar7,0.0,1.0);
      pvVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
               operator[](&this->m_attribData,(long)(direction << 1));
      *(undefined8 *)pvVar6->m_data = local_b4.m_data._0_8_;
      *(undefined8 *)(pvVar6->m_data + 2) = local_b4.m_data._8_8_;
      pvVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
               operator[](&this->m_attribData,(long)(direction * 2 + 1));
      *(pointer *)pvVar6->m_data =
           cellOrder.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
      *(undefined8 *)(pvVar6->m_data + 2) = blue.m_data._0_8_;
    }
    else {
      fVar7 = (float)*(int *)&(this->super_BBoxRenderCase).field_0xd4;
      tcu::Vector<float,_4>::Vector
                (&local_a4,(float)local_94 / fVar7,(float)local_90 / fVar7,0.0,1.0);
      pvVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
               operator[](&this->m_attribData,(long)(direction << 1));
      *(undefined8 *)pvVar6->m_data = local_a4.m_data._0_8_;
      *(undefined8 *)(pvVar6->m_data + 2) = local_a4.m_data._8_8_;
      pvVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
               operator[](&this->m_attribData,(long)(direction * 2 + 1));
      *(undefined8 *)pvVar6->m_data = blue.m_data._8_8_;
      *(undefined8 *)(pvVar6->m_data + 2) = green.m_data._0_8_;
    }
    direction = direction + 1;
  }
  de::Random::~Random((Random *)local_6c);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_48);
  return;
}

Assistant:

void PointRenderCase::generateAttributeData (void)
{
	const tcu::Vec4		green		(0.0f, 1.0f, 0.0f, 1.0f);
	const tcu::Vec4		blue		(0.0f, 0.0f, 1.0f, 1.0f);
	std::vector<int>	cellOrder	(m_numStripes * m_numStripes * 2);
	de::Random			rnd			(0xDE22446);

	for (int ndx = 0; ndx < (int)cellOrder.size(); ++ndx)
		cellOrder[ndx] = ndx;
	rnd.shuffle(cellOrder.begin(), cellOrder.end());

	m_attribData.resize(cellOrder.size() * 2);
	for (int ndx = 0; ndx < (int)cellOrder.size(); ++ndx)
	{
		const int pointID		= cellOrder[ndx];
		const int direction		= pointID & 0x01;
		const int majorCoord	= (pointID >> 1) / m_numStripes;
		const int minorCoord	= (pointID >> 1) % m_numStripes;

		if (direction)
		{
			m_attribData[ndx * VA_NUM_ATTRIB_VECS + VA_POS_VEC_NDX] = tcu::Vec4(float(minorCoord) / float(m_numStripes), float(majorCoord) / float(m_numStripes), 0.0f, 1.0f);
			m_attribData[ndx * VA_NUM_ATTRIB_VECS + VA_COL_VEC_NDX] = green;
		}
		else
		{
			m_attribData[ndx * VA_NUM_ATTRIB_VECS + VA_POS_VEC_NDX] = tcu::Vec4(((float)majorCoord + 0.5f) / float(m_numStripes), ((float)minorCoord + 0.5f) / float(m_numStripes), 0.0f, 1.0f);
			m_attribData[ndx * VA_NUM_ATTRIB_VECS + VA_COL_VEC_NDX] = blue;
		}
	}
}